

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O1

int xml_parse_file_flags(xar *xar,char *name)

{
  xar_file *pxVar1;
  bool bVar2;
  int iVar3;
  xmlstatus xVar4;
  char *p;
  
  iVar3 = strcmp(name,"UserNoDump");
  if (iVar3 == 0) {
    p = "nodump";
    xVar4 = FILE_FLAGS_USER_NODUMP;
  }
  else {
    iVar3 = strcmp(name,"UserImmutable");
    if (iVar3 == 0) {
      p = "uimmutable";
      xVar4 = FILE_FLAGS_USER_IMMUTABLE;
    }
    else {
      iVar3 = strcmp(name,"UserAppend");
      if (iVar3 == 0) {
        p = "uappend";
        xVar4 = FILE_FLAGS_USER_APPEND;
      }
      else {
        iVar3 = strcmp(name,"UserOpaque");
        if (iVar3 == 0) {
          p = "opaque";
          xVar4 = FILE_FLAGS_USER_OPAQUE;
        }
        else {
          iVar3 = strcmp(name,"UserNoUnlink");
          if (iVar3 == 0) {
            p = "nouunlink";
            xVar4 = FILE_FLAGS_USER_NOUNLINK;
          }
          else {
            iVar3 = strcmp(name,"SystemArchived");
            if (iVar3 == 0) {
              p = "archived";
              xVar4 = FILE_FLAGS_SYS_ARCHIVED;
            }
            else {
              iVar3 = strcmp(name,"SystemImmutable");
              if (iVar3 == 0) {
                p = "simmutable";
                xVar4 = FILE_FLAGS_SYS_IMMUTABLE;
              }
              else {
                iVar3 = strcmp(name,"SystemAppend");
                if (iVar3 == 0) {
                  p = "sappend";
                  xVar4 = FILE_FLAGS_SYS_APPEND;
                }
                else {
                  iVar3 = strcmp(name,"SystemNoUnlink");
                  if (iVar3 == 0) {
                    p = "nosunlink";
                    xVar4 = FILE_FLAGS_SYS_NOUNLINK;
                  }
                  else {
                    iVar3 = strcmp(name,"SystemSnapshot");
                    if (iVar3 != 0) {
                      bVar2 = true;
                      p = (char *)0x0;
                      goto LAB_001393e0;
                    }
                    p = "snapshot";
                    xVar4 = FILE_FLAGS_SYS_SNAPSHOT;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  xar->xmlsts = xVar4;
  bVar2 = false;
LAB_001393e0:
  iVar3 = 0;
  if (!bVar2) {
    pxVar1 = xar->file;
    pxVar1->has = pxVar1->has | 0x1000;
    if ((pxVar1->fflags_text).length != 0) {
      archive_strappend_char(&pxVar1->fflags_text,',');
    }
    archive_strcat(&xar->file->fflags_text,p);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int
xml_parse_file_flags(struct xar *xar, const char *name)
{
	const char *flag = NULL;

	if (strcmp(name, "UserNoDump") == 0) {
		xar->xmlsts = FILE_FLAGS_USER_NODUMP;
		flag = "nodump";
	}
	else if (strcmp(name, "UserImmutable") == 0) {
		xar->xmlsts = FILE_FLAGS_USER_IMMUTABLE;
		flag = "uimmutable";
	}
	else if (strcmp(name, "UserAppend") == 0) {
		xar->xmlsts = FILE_FLAGS_USER_APPEND;
		flag = "uappend";
	}
	else if (strcmp(name, "UserOpaque") == 0) {
		xar->xmlsts = FILE_FLAGS_USER_OPAQUE;
		flag = "opaque";
	}
	else if (strcmp(name, "UserNoUnlink") == 0) {
		xar->xmlsts = FILE_FLAGS_USER_NOUNLINK;
		flag = "nouunlink";
	}
	else if (strcmp(name, "SystemArchived") == 0) {
		xar->xmlsts = FILE_FLAGS_SYS_ARCHIVED;
		flag = "archived";
	}
	else if (strcmp(name, "SystemImmutable") == 0) {
		xar->xmlsts = FILE_FLAGS_SYS_IMMUTABLE;
		flag = "simmutable";
	}
	else if (strcmp(name, "SystemAppend") == 0) {
		xar->xmlsts = FILE_FLAGS_SYS_APPEND;
		flag = "sappend";
	}
	else if (strcmp(name, "SystemNoUnlink") == 0) {
		xar->xmlsts = FILE_FLAGS_SYS_NOUNLINK;
		flag = "nosunlink";
	}
	else if (strcmp(name, "SystemSnapshot") == 0) {
		xar->xmlsts = FILE_FLAGS_SYS_SNAPSHOT;
		flag = "snapshot";
	}

	if (flag == NULL)
		return (0);
	xar->file->has |= HAS_FFLAGS;
	if (archive_strlen(&(xar->file->fflags_text)) > 0)
		archive_strappend_char(&(xar->file->fflags_text), ',');
	archive_strcat(&(xar->file->fflags_text), flag);
	return (1);
}